

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_cast_operator.hpp
# Opt level: O0

bool duckdb::TryDoubleCast<float>
               (char *buf,idx_t len,float *result,bool strict,char decimal_separator)

{
  bool bVar1;
  byte in_CL;
  byte bVar2;
  ulong in_RSI;
  char *in_RDI;
  from_chars_result fVar3;
  char *current_end;
  from_chars_result parse_result;
  char *endptr;
  chars_format in_stack_00000270;
  char in_stack_00000276;
  undefined1 in_stack_00000277;
  float *in_stack_00000278;
  char *in_stack_00000280;
  char *in_stack_00000288;
  bool local_4a;
  bool local_49;
  char *local_48;
  ulong local_18;
  char *local_10;
  bool local_1;
  
  bVar2 = in_CL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    local_49 = false;
    if (local_18 != 0) {
      local_49 = StringUtil::CharacterIsSpace(*local_10);
    }
    if (local_49 == false) break;
    local_10 = local_10 + 1;
    local_18 = local_18 - 1;
  }
  if (local_18 == 0) {
    local_1 = false;
  }
  else {
    if (*local_10 == '+') {
      if (bVar2 != 0) {
        return false;
      }
      local_10 = local_10 + 1;
      local_18 = local_18 - 1;
    }
    if ((((bVar2 == 0) || (local_18 < 2)) || (*local_10 != '0')) ||
       (bVar1 = StringUtil::CharacterIsDigit(local_10[1]), !bVar1)) {
      fVar3 = duckdb_fast_float::from_chars<float>
                        (in_stack_00000288,in_stack_00000280,in_stack_00000278,
                         (bool)in_stack_00000277,in_stack_00000276,in_stack_00000270);
      local_48 = fVar3.ptr;
      if (fVar3.ec == 0) {
        if (bVar2 == 0) {
          while( true ) {
            local_4a = false;
            if (local_48 < local_10 + local_18) {
              local_4a = StringUtil::CharacterIsSpace(*local_48);
            }
            if (local_4a == false) break;
            local_48 = local_48 + 1;
          }
        }
        local_1 = local_48 == local_10 + local_18;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool TryDoubleCast(const char *buf, idx_t len, T &result, bool strict, char decimal_separator = '.') {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (*buf == '+') {
		if (strict) {
			// plus is not allowed in strict mode
			return false;
		}
		buf++;
		len--;
	}
	if (strict && len >= 2) {
		if (buf[0] == '0' && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	auto endptr = buf + len;
	auto parse_result = duckdb_fast_float::from_chars(buf, buf + len, result, strict, decimal_separator);
	if (parse_result.ec != std::errc()) {
		return false;
	}
	auto current_end = parse_result.ptr;
	if (!strict) {
		while (current_end < endptr && StringUtil::CharacterIsSpace(*current_end)) {
			current_end++;
		}
	}
	return current_end == endptr;
}